

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall
Table_TableMustHaveAtLeastOneKey_Test::~Table_TableMustHaveAtLeastOneKey_Test
          (Table_TableMustHaveAtLeastOneKey_Test *this)

{
  Table_TableMustHaveAtLeastOneKey_Test *this_local;
  
  ~Table_TableMustHaveAtLeastOneKey_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Table, TableMustHaveAtLeastOneKey) {
    std::istringstream input("[  ]");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(3, e.offset());
    }
}